

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::Path::Path(Path *this,Path *rhs)

{
  bool bVar1;
  pointer pcVar2;
  
  (this->_prim_part)._M_dataplus._M_p = (pointer)&(this->_prim_part).field_2;
  pcVar2 = (rhs->_prim_part)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (rhs->_prim_part)._M_string_length);
  (this->_prop_part)._M_dataplus._M_p = (pointer)&(this->_prop_part).field_2;
  pcVar2 = (rhs->_prop_part)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_prop_part,pcVar2,pcVar2 + (rhs->_prop_part)._M_string_length);
  (this->_variant_part)._M_dataplus._M_p = (pointer)&(this->_variant_part).field_2;
  pcVar2 = (rhs->_variant_part)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_variant_part,pcVar2,pcVar2 + (rhs->_variant_part)._M_string_length);
  (this->_variant_selection_part)._M_dataplus._M_p =
       (pointer)&(this->_variant_selection_part).field_2;
  pcVar2 = (rhs->_variant_selection_part)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_variant_selection_part,pcVar2,
             pcVar2 + (rhs->_variant_selection_part)._M_string_length);
  (this->_variant_part_str)._M_dataplus._M_p = (pointer)&(this->_variant_part_str).field_2;
  pcVar2 = (rhs->_variant_part_str)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_variant_part_str,pcVar2,
             pcVar2 + (rhs->_variant_part_str)._M_string_length);
  (this->_element)._M_dataplus._M_p = (pointer)&(this->_element).field_2;
  pcVar2 = (rhs->_element)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_element,pcVar2,pcVar2 + (rhs->_element)._M_string_length);
  bVar1 = (rhs->_path_type).has_value_;
  (this->_path_type).has_value_ = bVar1;
  if (bVar1 == true) {
    (this->_path_type).contained = (rhs->_path_type).contained;
  }
  this->_valid = rhs->_valid;
  return;
}

Assistant:

Path(const Path &rhs) = default;